

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgDreamState.hpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
TasDREAM::TasmanianDREAM::getApproximateMode
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,TasmanianDREAM *this)

{
  TasmanianDREAM *this_local;
  vector<double,_std::allocator<double>_> *mode;
  
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__);
  getApproximateMode(this,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> getApproximateMode() const{
        std::vector<double> mode;
        getApproximateMode(mode);
        return mode;
    }